

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O2

int Gia_ManCofOneDerive(Ccf_Man_t *p,int LitProp)

{
  Vec_Int_t *pVVar1;
  Gia_Man_t *p_00;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  uint *puVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  
  pVVar1 = p->vCopies;
  uVar5 = p->pFrames->nObjs;
  Vec_IntGrow(pVVar1,uVar5);
  uVar6 = 0;
  uVar9 = 0;
  if (0 < (int)uVar5) {
    uVar9 = (ulong)uVar5;
  }
  for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
    pVVar1->pArray[uVar6] = -1;
  }
  pVVar1->nSize = uVar5;
  iVar3 = Abc_Lit2Var(LitProp);
  Gia_ManCofOneDerive_rec(p,iVar3);
  pVVar1 = p->vCopies;
  iVar3 = Abc_Lit2Var(LitProp);
  iVar3 = Vec_IntEntry(pVVar1,iVar3);
  iVar4 = Abc_LitIsCompl(LitProp);
  uVar5 = Abc_LitNotCond(iVar3,iVar4);
  p_00 = p->pFrames;
  iVar3 = Abc_Lit2Var(uVar5);
  if (p_00->nObjs <= iVar3) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  iVar3 = Abc_Lit2Var(uVar5);
  pGVar7 = Gia_ManObj(p_00,iVar3);
  if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && (int)*(uint *)pGVar7 < 0) {
    __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  uVar11 = p_00->nObjs;
  if (uVar11 == p_00->nObjsAlloc) {
    uVar2 = uVar11 * 2;
    if (0x1fffffff < (int)(uVar11 * 2)) {
      uVar2 = 0x20000000;
    }
    if (uVar11 == 0x20000000) {
      puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
      exit(1);
    }
    if ((int)uVar2 <= (int)uVar11) {
      __assert_fail("p->nObjs < nObjNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x289,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    if (p_00->fVerbose != 0) {
      printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar11,(ulong)uVar2);
      uVar11 = p_00->nObjsAlloc;
    }
    if ((int)uVar11 < 1) {
      __assert_fail("p->nObjsAlloc > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x28c,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    lVar10 = (long)(int)uVar2;
    if (p_00->pObjs == (Gia_Obj_t *)0x0) {
      pGVar7 = (Gia_Obj_t *)malloc(lVar10 * 0xc);
    }
    else {
      pGVar7 = (Gia_Obj_t *)realloc(p_00->pObjs,lVar10 * 0xc);
      uVar11 = p_00->nObjsAlloc;
    }
    p_00->pObjs = pGVar7;
    memset(pGVar7 + (int)uVar11,0,(long)(int)(uVar2 - uVar11) * 0xc);
    if (p_00->pMuxes != (uint *)0x0) {
      puVar8 = (uint *)realloc(p_00->pMuxes,lVar10 * 4);
      p_00->pMuxes = puVar8;
      memset(puVar8 + p_00->nObjsAlloc,0,(lVar10 - p_00->nObjsAlloc) * 4);
    }
    p_00->nObjsAlloc = uVar2;
  }
  if ((p_00->vHTable).nSize != 0) {
    Vec_IntPush(&p_00->vHash,0);
  }
  iVar3 = p_00->nObjs;
  p_00->nObjs = iVar3 + 1;
  pGVar7 = Gia_ManObj(p_00,iVar3);
  pGVar7->field_0x3 = pGVar7->field_0x3 | 0x80;
  iVar3 = Gia_ObjId(p_00,pGVar7);
  iVar4 = Abc_Lit2Var(uVar5);
  *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffe0000000 | (ulong)(iVar3 - iVar4 & 0x1fffffff);
  iVar3 = Abc_LitIsCompl(uVar5);
  uVar6 = *(ulong *)pGVar7;
  *(ulong *)pGVar7 = uVar6 & 0xffffffffdfffffff | (ulong)(uint)(iVar3 << 0x1d);
  *(ulong *)pGVar7 =
       uVar6 & 0xe0000000dfffffff | (ulong)(uint)(iVar3 << 0x1d) |
       (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
  pVVar1 = p_00->vCos;
  iVar3 = Gia_ObjId(p_00,pGVar7);
  Vec_IntPush(pVVar1,iVar3);
  if (p_00->pFanData != (int *)0x0) {
    Gia_ObjAddFanout(p_00,pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff),pGVar7);
  }
  Gia_ObjId(p_00,pGVar7);
  Gia_ManCofExtendSolver(p);
  return uVar5 ^ 1;
}

Assistant:

int Gia_ManCofOneDerive( Ccf_Man_t * p, int LitProp )
{
    int LitOut;
    // derive the cofactor of the property node
    Vec_IntFill( p->vCopies, Gia_ManObjNum(p->pFrames), -1 );
    Gia_ManCofOneDerive_rec( p, Abc_Lit2Var(LitProp) );
    LitOut = Vec_IntEntry( p->vCopies, Abc_Lit2Var(LitProp) );
    LitOut = Abc_LitNotCond( LitOut, Abc_LitIsCompl(LitProp) );
    // add new PO for the cofactor
    Gia_ManAppendCo( p->pFrames, LitOut );
    // add SAT clauses
    Gia_ManCofExtendSolver( p );
    // return negative literal of the cofactor
    return Abc_LitNot(LitOut);
}